

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

void __thiscall ON_NurbsCurve::SetUnclampedTagForExperts(ON_NurbsCurve *this,bool bUnclampedTag)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  if ((((int)CONCAT71(in_register_00000031,bUnclampedTag) != 0) &&
      (bVar2 = Internal_UnclampedKnots(this->m_order,this->m_cv_count,this->m_cv,this->m_knot),
      bVar2)) &&
     (iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                        (this), (char)iVar3 == '\0')) {
    pbVar1 = (byte *)((long)&this->m_knot_capacity_and_tags + 3);
    *pbVar1 = *pbVar1 | 0x40;
    return;
  }
  pbVar1 = (byte *)((long)&this->m_knot_capacity_and_tags + 3);
  *pbVar1 = *pbVar1 & 0xbf;
  return;
}

Assistant:

void ON_NurbsCurve::SetUnclampedTagForExperts(
  bool bUnclampedTag
)
{
  if (
    bUnclampedTag
    && Internal_UnclampedKnots(m_order, m_cv_count, m_cv, m_knot)
    && false == this->IsPeriodic()
    )
    m_knot_capacity_and_tags |= ON_NurbsCurve::masks::unclamped_knots_tag;
  else
    m_knot_capacity_and_tags &= ~ON_NurbsCurve::masks::unclamped_knots_tag;
}